

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiInputEvent>::push_back(ImVector<ImGuiInputEvent> *this,ImGuiInputEvent *v)

{
  undefined8 uVar1;
  ImGuiInputEvent *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiInputEvent> *in_RDI;
  ImVector<ImGuiInputEvent> *unaff_retaddr;
  ImVector<ImGuiInputEvent> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data + in_RDI->Size;
  uVar1 = *in_RSI;
  pIVar2->Type = (int)uVar1;
  pIVar2->Source = (int)((ulong)uVar1 >> 0x20);
  (pIVar2->field_2).MousePos = *(ImGuiInputEventMousePos *)(in_RSI + 1);
  *(undefined8 *)((long)&pIVar2->field_2 + 8) = in_RSI[2];
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }